

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkMiter(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fComb,int nPartSize,int fImplic,int fMulti)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  void *pvVar6;
  int iVar7;
  int iVar8;
  uint i;
  char *__assertion;
  int iVar9;
  uint uVar10;
  int i_00;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  char local_818 [1024];
  char local_418 [1000];
  
  if (pNtk1->nObjCounts[8] == pNtk1->vBoxes->nSize) {
    if (pNtk2->nObjCounts[8] == pNtk2->vBoxes->nSize) {
      iVar2 = Abc_NtkCompareSignals(pNtk1,pNtk2,fImplic,fComb);
      if (iVar2 == 0) {
        pNtkMiter = (Abc_Ntk_t *)0x0;
      }
      else {
        if ((pNtk1->ntkType == ABC_NTK_STRASH) && (iVar2 = Abc_NtkGetChoiceNum(pNtk1), iVar2 == 0))
        {
          bVar12 = false;
        }
        else {
          pNtk1 = Abc_NtkStrash(pNtk1,0,0,0);
          bVar12 = pNtk1 != (Abc_Ntk_t *)0x0;
        }
        if ((pNtk2->ntkType == ABC_NTK_STRASH) && (iVar2 = Abc_NtkGetChoiceNum(pNtk2), iVar2 == 0))
        {
          bVar13 = false;
        }
        else {
          pNtk2 = Abc_NtkStrash(pNtk2,0,0,0);
          bVar13 = pNtk2 != (Abc_Ntk_t *)0x0;
        }
        if (pNtk2 == (Abc_Ntk_t *)0x0 || pNtk1 == (Abc_Ntk_t *)0x0) {
          pNtkMiter = (Abc_Ntk_t *)0x0;
        }
        else {
          if (pNtk1->ntkType != ABC_NTK_STRASH) {
            __assertion = "Abc_NtkIsStrash(pNtk1)";
            pcVar3 = "Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)";
            uVar10 = 0x5e;
            goto LAB_002943a3;
          }
          if (pNtk2->ntkType != ABC_NTK_STRASH) {
            __assertion = "Abc_NtkIsStrash(pNtk2)";
            pcVar3 = "Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)";
            uVar10 = 0x5f;
            goto LAB_002943a3;
          }
          pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
          sprintf(local_418,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
          pcVar3 = Extra_UtilStrsav(local_418);
          pNtkMiter->pName = pcVar3;
          Abc_NtkMiterPrepare(pNtk1,pNtk2,pNtkMiter,fComb,nPartSize,fMulti);
          Abc_NtkMiterAddOne(pNtk1,pNtkMiter);
          Abc_NtkMiterAddOne(pNtk2,pNtkMiter);
          if (fMulti != 0 && nPartSize != 0) {
            __assert_fail("nPartSize == 0 || fMulti == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                          ,0x11e,
                          "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                         );
          }
          p = Vec_PtrAlloc(100);
          if (fComb == 0) {
            for (iVar2 = 0; iVar2 < pNtk1->vPos->nSize; iVar2 = iVar2 + 1) {
              pAVar4 = Abc_NtkPo(pNtk1,iVar2);
              if (fMulti == 0) {
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                Vec_PtrPush(p,pAVar4);
                pAVar4 = Abc_NtkPo(pNtk2,iVar2);
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                Vec_PtrPush(p,pAVar4);
              }
              else {
                pAVar1 = (Abc_Aig_t *)pNtkMiter->pManFunc;
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                pAVar5 = Abc_NtkCo(pNtk2,iVar2);
                pAVar5 = Abc_ObjChild0Copy(pAVar5);
                pAVar4 = Abc_AigXor(pAVar1,pAVar4,pAVar5);
                pAVar5 = Abc_NtkPo(pNtkMiter,iVar2);
                Abc_ObjAddFanin(pAVar5,pAVar4);
              }
            }
            for (iVar2 = 0; iVar2 < pNtk1->vBoxes->nSize; iVar2 = iVar2 + 1) {
              pAVar4 = Abc_NtkBox(pNtk1,iVar2);
              if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
                pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
                pAVar5 = (pAVar4->field_6).pCopy;
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                Abc_ObjAddFanin(pAVar5,pAVar4);
              }
            }
            for (iVar2 = 0; iVar2 < pNtk2->vBoxes->nSize; iVar2 = iVar2 + 1) {
              pAVar4 = Abc_NtkBox(pNtk2,iVar2);
              if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
                pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
                pAVar5 = (pAVar4->field_6).pCopy;
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                Abc_ObjAddFanin(pAVar5,pAVar4);
              }
            }
          }
          else {
            for (iVar2 = 0; iVar2 < pNtk1->vCos->nSize; iVar2 = iVar2 + 1) {
              pAVar4 = Abc_NtkCo(pNtk1,iVar2);
              if (fMulti == 0) {
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                Vec_PtrPush(p,pAVar4);
                pAVar4 = Abc_NtkCo(pNtk2,iVar2);
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                Vec_PtrPush(p,pAVar4);
              }
              else {
                pAVar1 = (Abc_Aig_t *)pNtkMiter->pManFunc;
                pAVar4 = Abc_ObjChild0Copy(pAVar4);
                pAVar5 = Abc_NtkCo(pNtk2,iVar2);
                pAVar5 = Abc_ObjChild0Copy(pAVar5);
                pAVar4 = Abc_AigXor(pAVar1,pAVar4,pAVar5);
                pAVar5 = Abc_NtkPo(pNtkMiter,iVar2);
                Abc_ObjAddFanin(pAVar5,pAVar4);
              }
            }
          }
          if (nPartSize < 1) {
            if (fMulti == 0) {
              pAVar4 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,p,fImplic);
              pAVar5 = Abc_NtkPo(pNtkMiter,0);
              Abc_ObjAddFanin(pAVar5,pAVar4);
            }
          }
          else {
            iVar2 = pNtk1->vCos->nSize;
            if (p->nSize != iVar2 * 2) {
              __assert_fail("Vec_PtrSize(vPairs) == 2 * Abc_NtkCoNum(pNtk1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                            ,0x158,
                            "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                           );
            }
            uVar10 = (uint)(0 < iVar2 % nPartSize) + iVar2 / nPartSize;
            p_00 = Vec_PtrAlloc(nPartSize);
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            iVar7 = 0;
            iVar2 = 1;
            for (i = 0; i != uVar10; i = i + 1) {
              p_00->nSize = 0;
              i_00 = iVar2;
              iVar9 = nPartSize;
              for (iVar8 = iVar7;
                  (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11 && (iVar8 < pNtk1->vCos->nSize));
                  iVar8 = iVar8 + 1) {
                pvVar6 = Vec_PtrEntry(p,i_00 + -1);
                Vec_PtrPush(p_00,pvVar6);
                pvVar6 = Vec_PtrEntry(p,i_00);
                Vec_PtrPush(p_00,pvVar6);
                i_00 = i_00 + 2;
              }
              pAVar4 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,p_00,fImplic);
              pAVar5 = Abc_NtkCreatePo(pNtkMiter);
              Abc_ObjAddFanin(pAVar5,pAVar4);
              if (nPartSize == 1) {
                pAVar4 = Abc_NtkCo(pNtk1,i);
                pcVar3 = Abc_ObjName(pAVar4);
                strcpy(local_818,pcVar3);
              }
              else {
                sprintf(local_818,"%d",(ulong)i);
              }
              Abc_ObjAssignName(pAVar5,"miter_",local_818);
              iVar2 = iVar2 + nPartSize * 2;
              iVar7 = iVar7 + nPartSize;
            }
            Vec_PtrFree(p_00);
          }
          Vec_PtrFree(p);
          Abc_AigCleanup((Abc_Aig_t *)pNtkMiter->pManFunc);
          iVar2 = Abc_NtkCheck(pNtkMiter);
          if (iVar2 == 0) {
            puts("Abc_NtkMiter: The network check has failed.");
            Abc_NtkDelete(pNtkMiter);
            pNtkMiter = (Abc_Ntk_t *)0x0;
          }
        }
        if (bVar12) {
          Abc_NtkDelete(pNtk1);
        }
        if (bVar13) {
          Abc_NtkDelete(pNtk2);
        }
      }
      return pNtkMiter;
    }
    __assertion = "Abc_NtkHasOnlyLatchBoxes(pNtk2)";
    pcVar3 = "Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)";
    uVar10 = 0x40;
  }
  else {
    __assertion = "Abc_NtkHasOnlyLatchBoxes(pNtk1)";
    pcVar3 = "Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)";
    uVar10 = 0x3f;
  }
LAB_002943a3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                ,uVar10,pcVar3);
}

Assistant:

Abc_Ntk_t * Abc_NtkMiter( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fComb, int nPartSize, int fImplic, int fMulti )
{
    Abc_Ntk_t * pTemp = NULL;
    int fRemove1, fRemove2;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk1) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk2) );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, fImplic, fComb ) )
        return NULL;
    // make sure the circuits are strashed 
    fRemove1 = (!Abc_NtkIsStrash(pNtk1) || Abc_NtkGetChoiceNum(pNtk1)) && (pNtk1 = Abc_NtkStrash(pNtk1, 0, 0, 0));
    fRemove2 = (!Abc_NtkIsStrash(pNtk2) || Abc_NtkGetChoiceNum(pNtk2)) && (pNtk2 = Abc_NtkStrash(pNtk2, 0, 0, 0));
    if ( pNtk1 && pNtk2 )
        pTemp = Abc_NtkMiterInt( pNtk1, pNtk2, fComb, nPartSize, fImplic, fMulti );
    if ( fRemove1 )  Abc_NtkDelete( pNtk1 );
    if ( fRemove2 )  Abc_NtkDelete( pNtk2 );
    return pTemp;
}